

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

uint nelbereths_at(level *lev,xchar x,xchar y)

{
  char *pcVar1;
  uint uVar2;
  char *str;
  
  while( true ) {
    if (lev == (level *)0x0) {
      return 0;
    }
    if ((lev->levname[0x20] == x) && (lev->levname[0x21] == y)) break;
    lev = *(level **)lev->levname;
  }
  if (lev->levname[0x22] == '\x06') {
    return 0;
  }
  str = *(char **)(lev->levname + 8);
  pcVar1 = strstri(str,"Elbereth");
  if (pcVar1 == (char *)0x0) {
    return 0;
  }
  uVar2 = 0;
  do {
    str = str + 8;
    uVar2 = uVar2 + 1;
    pcVar1 = strstri(str,"Elbereth");
  } while (pcVar1 != (char *)0x0);
  return uVar2;
}

Assistant:

static unsigned int nelbereths_at(struct level *lev, xchar x, xchar y)
{
	const char *s = "Elbereth";
	size_t s_len = strlen(s);
	struct engr *ep = engr_at(lev, x, y);
	unsigned int count = 0;
	const char *p;

	if (!ep || ep->engr_type == HEADSTONE)
	    return 0;

	p = ep->engr_txt;
	while (strstri(p, s)) {
	    count++;
	    p += s_len;
	}

	return count;
}